

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O2

void __thiscall helics::MultiBroker::removeRoute(MultiBroker *this,route_id rid)

{
  const_iterator __position;
  
  __position._M_current =
       (this->routingTable).
       super__Vector_base<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (__position._M_current ==
        (this->routingTable).
        super__Vector_base<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    if (((__position._M_current)->first).rid == rid.rid) break;
    __position._M_current = __position._M_current + 1;
  }
  CLI::std::
  vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>::
  erase(&this->routingTable,__position);
  return;
}

Assistant:

void MultiBroker::removeRoute(route_id rid)
{
    for (auto it = routingTable.begin(); it != routingTable.end(); ++it) {
        if (it->first == rid) {
            routingTable.erase(it);
            return;
        }
    }
}